

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coins.cpp
# Opt level: O3

bool __thiscall CCoinsViewErrorCatcher::HaveCoin(CCoinsViewErrorCatcher *this,COutPoint *outpoint)

{
  long lVar1;
  int iVar2;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  iVar2 = (*((this->super_CCoinsViewBacked).base)->_vptr_CCoinsView[1])();
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return SUB41(iVar2,0);
  }
  __stack_chk_fail();
}

Assistant:

bool CCoinsViewErrorCatcher::HaveCoin(const COutPoint &outpoint) const {
    return ExecuteBackedWrapper([&]() { return CCoinsViewBacked::HaveCoin(outpoint); }, m_err_callbacks);
}